

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

void eatspecial(void)

{
  uint *puVar1;
  char cVar2;
  ushort uVar3;
  obj *otmp;
  boolean bVar4;
  uint uVar5;
  int tmp;
  int iVar6;
  uint uVar7;
  int incr;
  long numused;
  char *pcVar8;
  int ndx;
  
  otmp = victual.piece;
  set_occupation(eatfood,"eating non-food",0);
  lesshungry(victual.nmod);
  victual.piece = (obj *)0x0;
  victual._20_1_ = victual._20_1_ & 0xfb;
  occupation = (_func_int *)0x0;
  if (otmp->oclass == '\b') {
    otmp->quan = otmp->quan + 1;
    dopotion(otmp);
  }
  else if (otmp->oclass == '\f') {
    if (otmp->where == '\0') {
      dealloc_obj(otmp);
      return;
    }
    numused = (long)otmp->quan;
    goto LAB_001908d6;
  }
  uVar3 = otmp->otyp;
  iVar6 = (int)(short)uVar3;
  if ((otmp->oclass & 0xfeU) != 4) {
    if ((iVar6 == 0xf1) && (otmp->corpsenm != 0)) {
      o_unleash(otmp);
    }
    goto switchD_0019072a_caseD_a9;
  }
  uVar7 = u.uprops[objects[iVar6].oc_oprop].intrinsic;
  if (((uleft == otmp) || (uright == otmp)) && (Ring_gone(otmp), u.uhp < 1))
  goto switchD_0019072a_caseD_a9;
  otmp->field_0x4a = otmp->field_0x4a | 0x30;
  cVar2 = otmp->oclass;
  uVar5 = mt_random();
  if (uVar5 % ((uint)(cVar2 != '\x04') * 2 + 3) != 0) goto switchD_0019072a_caseD_a9;
  switch(otmp->otyp) {
  case 0x9d:
    pcVar8 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar8 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar8);
    incr = (int)otmp->spe;
    ndx = 5;
    goto LAB_00190aa8;
  case 0x9e:
    pcVar8 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar8 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar8);
    incr = (int)otmp->spe;
    ndx = 0;
    goto LAB_00190aa8;
  case 0x9f:
    pcVar8 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar8 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar8);
    incr = (int)otmp->spe;
    ndx = 4;
    goto LAB_00190aa8;
  case 0xa0:
    pcVar8 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar8 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar8);
    incr = (int)otmp->spe;
    ndx = 1;
    goto LAB_00190aa8;
  case 0xa1:
    pcVar8 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar8 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar8);
    incr = (int)otmp->spe;
    ndx = 2;
    goto LAB_00190aa8;
  case 0xa2:
    pcVar8 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar8 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar8);
    incr = (int)otmp->spe;
    ndx = 3;
LAB_00190aa8:
    bVar4 = adjattrib(ndx,incr,'\0',-1);
    if (bVar4 != '\0') {
LAB_00190abe:
      discover_object(iVar6,'\x01','\x01');
    }
    break;
  case 0xa3:
    pcVar8 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar8 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar8);
    u.uhitinc = u.uhitinc + otmp->spe;
    break;
  case 0xa4:
    pcVar8 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar8 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar8);
    u.udaminc = u.udaminc + otmp->spe;
    break;
  case 0xa5:
    pcVar8 = "amulet";
    if (otmp->oclass == '\x04') {
      pcVar8 = "ring";
    }
    pline("Magic spreads through your body as you digest the %s.",pcVar8);
    u.uprops[0x16].intrinsic._3_1_ = u.uprops[0x16].intrinsic._3_1_ | 4;
    u.ublessed = u.ublessed + otmp->spe;
LAB_00190ca2:
    iflags.botl = '\x01';
    break;
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
switchD_0019072a_caseD_a6:
    if ((ulong)objects[iVar6].oc_oprop == 0) break;
    if ((u.uprops[objects[iVar6].oc_oprop].intrinsic & 0x4000000) == 0) {
      pcVar8 = "amulet";
      if (otmp->oclass == '\x04') {
        pcVar8 = "ring";
      }
      pline("Magic spreads through your body as you digest the %s.",pcVar8);
    }
    puVar1 = &u.uprops[objects[iVar6].oc_oprop].intrinsic;
    *puVar1 = *puVar1 | 0x4000000;
    if (0xb9 < uVar3) {
      if (uVar3 == 0xbb) {
        resistcham();
      }
      else if (uVar3 == 0xba) {
        set_mimic_blocking();
        see_monsters();
        if (((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
               (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
             (u.uprops[0xd].blocked == 0)) && (uVar7 == 0)) &&
           ((u.uprops[0xc].extrinsic == 0 &&
            (uVar7 = (youmonst.data)->mflags1, (uVar7 >> 0x18 & 1) == 0)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if (ublindf == (obj *)0x0) {
              if ((uVar7 >> 0xc & 1) != 0) goto LAB_00190e1a;
            }
            else if (((uVar7 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_00190e1a;
          }
          else {
LAB_00190e1a:
            if ((ublindf == (obj *)0x0) || (ublindf->oartifact != '\x1d')) break;
          }
          newsym((int)u.ux,(int)u.uy);
          pline("Suddenly you can see yourself.");
          iVar6 = 0xba;
          goto LAB_00190abe;
        }
      }
      break;
    }
    if (uVar3 == 0xaa) {
      u.uprops[0x12].intrinsic = uVar7;
      if ((uVar7 == 0 && u.uprops[0x12].extrinsic == 0) && ((youmonst.data)->mlet != '\x05')) {
        float_up();
        uVar7 = 10;
        iVar6 = -10;
        do {
          uVar5 = mt_random();
          uVar7 = uVar7 + uVar5 % 0x14;
          iVar6 = iVar6 + 1;
        } while (iVar6 != 0);
        incr_itimeout(&u.uprops[0x12].intrinsic,(ulong)uVar7);
        iVar6 = 0xaa;
        goto LAB_00190abe;
      }
      break;
    }
    if ((((uVar3 != 0xb9) || (uVar7 != 0)) || (u.uprops[0xd].extrinsic != 0)) ||
       (((u.uprops[0xd].blocked != 0 || (u.uprops[0xc].intrinsic != 0)) ||
        ((u.uprops[0xc].extrinsic != 0 ||
         (uVar7 = (youmonst.data)->mflags1, (uVar7 >> 0x18 & 1) != 0)))))) break;
    if (u.uprops[0x1e].intrinsic == 0) {
      if (ublindf == (obj *)0x0) {
        if ((uVar7 >> 0xc & 1) != 0) goto LAB_00190c1b;
      }
      else if (((uVar7 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_00190c1b;
    }
    else {
LAB_00190c1b:
      if ((ublindf == (obj *)0x0) || (ublindf->oartifact != '\x1d')) break;
    }
    newsym((int)u.ux,(int)u.uy);
    pcVar8 = "strange";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar8 = "normal";
      }
      else {
        bVar4 = dmgtype(youmonst.data,0x24);
        pcVar8 = "strange";
        if (bVar4 == '\0') {
          pcVar8 = "normal";
        }
      }
    }
    pline("Your body takes on a %s transparency...",pcVar8);
    iVar6 = 0xb9;
    goto LAB_00190abe;
  case 0xa9:
    break;
  case 0xb3:
    if ((u.uprops[3].intrinsic & 0x4000000) == 0) {
      pcVar8 = "amulet";
      if (otmp->oclass == '\x04') {
        pcVar8 = "ring";
      }
      pline("Magic spreads through your body as you digest the %s.",pcVar8);
    }
    if (((u.uprops[3].extrinsic == 0 && u.uprops[3].intrinsic == 0) &&
        (((byte)youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)) {
      pline("You feel wide awake.");
    }
    u.uprops[3].intrinsic = u.uprops[3].intrinsic | 0x4000000;
    break;
  default:
    switch(otmp->otyp) {
    case 0xca:
    case 0xd0:
      break;
    case 0xcb:
      choke(otmp);
      break;
    case 0xcc:
      if ((u.uprops[0x1f].intrinsic & 0x4000000) == 0) {
        pcVar8 = "amulet";
        if (otmp->oclass == '\x04') {
          pcVar8 = "ring";
        }
        pline("Magic spreads through your body as you digest the %s.",pcVar8);
      }
      uVar7 = mt_random();
      u.uprops[0x1f].intrinsic = uVar7 % 100 + 0x4000001;
      break;
    default:
      goto switchD_0019072a_caseD_a6;
    case 0xce:
      pcVar8 = "amulet";
      if (otmp->oclass == '\x04') {
        pcVar8 = "ring";
      }
      pline("Magic spreads through your body as you digest the %s.",pcVar8);
      discover_object(iVar6,'\x01','\x01');
      change_sex();
      pcVar8 = "feminine";
      if (flags.female == '\0') {
        pcVar8 = "masculine";
      }
      pline("You are suddenly very %s!",pcVar8);
      goto LAB_00190ca2;
    case 0xcf:
      if ((u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) &&
         (u.umonnum != u.umonster)) {
        pcVar8 = "amulet";
        if (otmp->oclass == '\x04') {
          pcVar8 = "ring";
        }
        pline("Magic spreads through your body as you digest the %s.",pcVar8);
        discover_object(iVar6,'\x01','\x01');
        rehumanize();
      }
    }
  }
switchD_0019072a_caseD_a9:
  if ((otmp->otyp == 0x10) && ((otmp->field_0x4a & 1) == 0)) {
    pcVar8 = "That was pure chewing satisfaction!";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar8 = "Four out of five dentists agree.";
      }
      else {
        bVar4 = dmgtype(youmonst.data,0x24);
        pcVar8 = "That was pure chewing satisfaction!";
        if (bVar4 == '\0') {
          pcVar8 = "Four out of five dentists agree.";
        }
      }
    }
    pline(pcVar8);
    exercise(2,'\x01');
  }
  if ((otmp->otyp == 0x212) && ((otmp->field_0x4a & 1) == 0)) {
    pline("Yabba-dabba delicious!");
    exercise(4,'\x01');
  }
  if ((otmp == uwep) && (otmp->quan == 1)) {
    uwepgone();
  }
  if ((otmp == uquiver) && (otmp->quan == 1)) {
    uqwepgone();
  }
  if ((otmp == uswapwep) && (otmp->quan == 1)) {
    uswapwepgone();
  }
  if (otmp == uball) {
    unpunish();
  }
  if (otmp == uchain) {
    unpunish();
    return;
  }
  if (otmp->where == '\x03') {
    useup(otmp);
    return;
  }
  numused = 1;
LAB_001908d6:
  useupf(otmp,numused);
  return;
}

Assistant:

static void eatspecial(void) /* called after eating non-food */
{
	struct obj *otmp = victual.piece;

	/* lesshungry wants an occupation to handle choke messages correctly */
	set_occupation(eatfood, "eating non-food", 0);
	lesshungry(victual.nmod);
	occupation = 0;
	victual.piece = NULL;
	victual.eating = 0;
	if (otmp->oclass == COIN_CLASS) {
		if (otmp->where == OBJ_FREE)
		    dealloc_obj(otmp);
		else
		    useupf(otmp, otmp->quan);
		return;
	}
	if (otmp->oclass == POTION_CLASS) {
		otmp->quan++; /* dopotion() does a useup() */
		dopotion(otmp);
	}
	if (otmp->oclass == RING_CLASS || otmp->oclass == AMULET_CLASS)
		eataccessory(otmp);
	else if (otmp->otyp == LEASH && otmp->leashmon)
		o_unleash(otmp);

	/* KMH -- idea by "Tommy the Terrorist" */
	if ((otmp->otyp == TRIDENT) && !otmp->cursed)
	{
		pline(Hallucination ? "Four out of five dentists agree." :
				"That was pure chewing satisfaction!");
		exercise(A_WIS, TRUE);
	}
	if ((otmp->otyp == FLINT) && !otmp->cursed)
	{
		pline("Yabba-dabba delicious!");
		exercise(A_CON, TRUE);
	}

	if (otmp == uwep && otmp->quan == 1L) uwepgone();
	if (otmp == uquiver && otmp->quan == 1L) uqwepgone();
	if (otmp == uswapwep && otmp->quan == 1L) uswapwepgone();

	if (otmp == uball) unpunish();
	if (otmp == uchain) unpunish(); /* but no useup() */
	else if (carried(otmp)) useup(otmp);
	else useupf(otmp, 1L);
}